

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool Curl_compareheader(char *headerline,char *header,size_t hlen,char *content,size_t clen)

{
  int iVar1;
  char *local_58;
  size_t len;
  Curl_str val;
  char *p;
  size_t clen_local;
  char *content_local;
  size_t hlen_local;
  char *header_local;
  char *headerline_local;
  
  iVar1 = curl_strnequal(headerline,header,hlen);
  if (iVar1 != 0) {
    val.len = (size_t)(headerline + hlen);
    iVar1 = Curl_str_untilnl((char **)&val.len,(Curl_str *)&len,0x4b000);
    if ((iVar1 == 0) && (Curl_str_trimblanks((Curl_str *)&len), clen <= val.str)) {
      val.len = len;
      for (local_58 = val.str; val.str <= local_58; local_58 = local_58 + -1) {
        iVar1 = curl_strnequal((char *)val.len,content,clen);
        if (iVar1 != 0) {
          return true;
        }
        val.len = val.len + 1;
      }
    }
  }
  return false;
}

Assistant:

bool
Curl_compareheader(const char *headerline, /* line to check */
                   const char *header,  /* header keyword _with_ colon */
                   const size_t hlen,   /* len of the keyword in bytes */
                   const char *content, /* content string to find */
                   const size_t clen)   /* len of the content in bytes */
{
  /* RFC2616, section 4.2 says: "Each header field consists of a name followed
   * by a colon (":") and the field value. Field names are case-insensitive.
   * The field value MAY be preceded by any amount of LWS, though a single SP
   * is preferred." */

  const char *p;
  struct Curl_str val;
  DEBUGASSERT(hlen);
  DEBUGASSERT(clen);
  DEBUGASSERT(header);
  DEBUGASSERT(content);

  if(!strncasecompare(headerline, header, hlen))
    return FALSE; /* does not start with header */

  /* pass the header */
  p = &headerline[hlen];

  if(Curl_str_untilnl(&p, &val, MAX_HTTP_RESP_HEADER_SIZE))
    return FALSE;
  Curl_str_trimblanks(&val);

  /* find the content string in the rest of the line */
  if(Curl_strlen(&val) >= clen) {
    size_t len;
    p = Curl_str(&val);
    for(len = Curl_strlen(&val); len >= Curl_strlen(&val); len--, p++) {
      if(strncasecompare(p, content, clen))
        return TRUE; /* match! */
    }
  }
  return FALSE; /* no match */
}